

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int tls1_prf(uchar *secret,size_t slen,char *label,uchar *random,size_t rlen,uchar *dstbuf,
            size_t dlen)

{
  uchar *input;
  int iVar1;
  size_t __n;
  mbedtls_md_info_t *pmVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uchar *puVar6;
  size_t ilen;
  ulong uVar7;
  mbedtls_md_context_t md_ctx;
  uchar h_i [20];
  uchar tmp [128];
  
  mbedtls_md_init(&md_ctx);
  __n = strlen(label);
  iVar1 = -0x7100;
  if (0xffffffffffffff7e < (__n + rlen) - 0x6d) {
    memcpy(tmp + 0x14,label,__n);
    memcpy(tmp + __n + 0x14,random,rlen);
    pmVar2 = mbedtls_md_info_from_type(MBEDTLS_MD_MD5);
    iVar1 = -0x6c00;
    if ((pmVar2 != (mbedtls_md_info_t *)0x0) &&
       (iVar1 = mbedtls_md_setup(&md_ctx,pmVar2,1), iVar1 == 0)) {
      ilen = __n + rlen;
      uVar5 = slen + 1 >> 1;
      mbedtls_md_hmac_starts(&md_ctx,secret,uVar5);
      mbedtls_md_hmac_update(&md_ctx,tmp + 0x14,ilen);
      mbedtls_md_hmac_finish(&md_ctx,tmp + 4);
      uVar7 = 0;
      puVar6 = dstbuf;
      while (uVar7 < dlen) {
        mbedtls_md_hmac_reset(&md_ctx);
        input = tmp + 4;
        mbedtls_md_hmac_update(&md_ctx,input,ilen + 0x10);
        mbedtls_md_hmac_finish(&md_ctx,h_i);
        mbedtls_md_hmac_reset(&md_ctx);
        mbedtls_md_hmac_update(&md_ctx,input,0x10);
        mbedtls_md_hmac_finish(&md_ctx,input);
        uVar7 = uVar7 + 0x10;
        uVar4 = 0x10;
        if (dlen < uVar7) {
          uVar4 = (ulong)((uint)dlen & 0xf);
        }
        for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
          puVar6[uVar3] = h_i[uVar3];
        }
        puVar6 = puVar6 + 0x10;
      }
      mbedtls_md_free(&md_ctx);
      pmVar2 = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
      iVar1 = -0x6c00;
      if ((pmVar2 != (mbedtls_md_info_t *)0x0) &&
         (iVar1 = mbedtls_md_setup(&md_ctx,pmVar2,1), iVar1 == 0)) {
        mbedtls_md_hmac_starts(&md_ctx,secret + (slen - uVar5),uVar5);
        mbedtls_md_hmac_update(&md_ctx,tmp + 0x14,ilen);
        mbedtls_md_hmac_finish(&md_ctx,tmp);
        uVar5 = 0;
        while (uVar5 < dlen) {
          mbedtls_md_hmac_reset(&md_ctx);
          mbedtls_md_hmac_update(&md_ctx,tmp,ilen + 0x14);
          mbedtls_md_hmac_finish(&md_ctx,h_i);
          mbedtls_md_hmac_reset(&md_ctx);
          mbedtls_md_hmac_update(&md_ctx,tmp,0x14);
          mbedtls_md_hmac_finish(&md_ctx,tmp);
          uVar5 = uVar5 + 0x14;
          uVar7 = 0x14;
          if (dlen < uVar5) {
            uVar7 = dlen % 0x14;
          }
          for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
            dstbuf[uVar4] = dstbuf[uVar4] ^ h_i[uVar4];
          }
          dstbuf = dstbuf + 0x14;
        }
        mbedtls_md_free(&md_ctx);
        mbedtls_zeroize(tmp,0x80);
        mbedtls_zeroize(h_i,0x14);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

static int tls1_prf( const unsigned char *secret, size_t slen,
                     const char *label,
                     const unsigned char *random, size_t rlen,
                     unsigned char *dstbuf, size_t dlen )
{
    size_t nb, hs;
    size_t i, j, k;
    const unsigned char *S1, *S2;
    unsigned char tmp[128];
    unsigned char h_i[20];
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;
    int ret;

    mbedtls_md_init( &md_ctx );

    if( sizeof( tmp ) < 20 + strlen( label ) + rlen )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    hs = ( slen + 1 ) / 2;
    S1 = secret;
    S2 = secret + slen - hs;

    nb = strlen( label );
    memcpy( tmp + 20, label, nb );
    memcpy( tmp + 20 + nb, random, rlen );
    nb += rlen;

    /*
     * First compute P_md5(secret,label+random)[0..dlen]
     */
    if( ( md_info = mbedtls_md_info_from_type( MBEDTLS_MD_MD5 ) ) == NULL )
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );

    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 1 ) ) != 0 )
        return( ret );

    mbedtls_md_hmac_starts( &md_ctx, S1, hs );
    mbedtls_md_hmac_update( &md_ctx, tmp + 20, nb );
    mbedtls_md_hmac_finish( &md_ctx, 4 + tmp );

    for( i = 0; i < dlen; i += 16 )
    {
        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, 4 + tmp, 16 + nb );
        mbedtls_md_hmac_finish( &md_ctx, h_i );

        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, 4 + tmp, 16 );
        mbedtls_md_hmac_finish( &md_ctx, 4 + tmp );

        k = ( i + 16 > dlen ) ? dlen % 16 : 16;

        for( j = 0; j < k; j++ )
            dstbuf[i + j]  = h_i[j];
    }

    mbedtls_md_free( &md_ctx );

    /*
     * XOR out with P_sha1(secret,label+random)[0..dlen]
     */
    if( ( md_info = mbedtls_md_info_from_type( MBEDTLS_MD_SHA1 ) ) == NULL )
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );

    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 1 ) ) != 0 )
        return( ret );

    mbedtls_md_hmac_starts( &md_ctx, S2, hs );
    mbedtls_md_hmac_update( &md_ctx, tmp + 20, nb );
    mbedtls_md_hmac_finish( &md_ctx, tmp );

    for( i = 0; i < dlen; i += 20 )
    {
        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, tmp, 20 + nb );
        mbedtls_md_hmac_finish( &md_ctx, h_i );

        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, tmp, 20 );
        mbedtls_md_hmac_finish( &md_ctx, tmp );

        k = ( i + 20 > dlen ) ? dlen % 20 : 20;

        for( j = 0; j < k; j++ )
            dstbuf[i + j] = (unsigned char)( dstbuf[i + j] ^ h_i[j] );
    }

    mbedtls_md_free( &md_ctx );

    mbedtls_zeroize( tmp, sizeof( tmp ) );
    mbedtls_zeroize( h_i, sizeof( h_i ) );

    return( 0 );
}